

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool __thiscall QSslSocket::waitForBytesWritten(QSslSocket *this,int msecs)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  undefined4 uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  plVar3 = *(long **)(lVar2 + 0x3f8);
  if (plVar3 == (long *)0x0) {
LAB_00252103:
    uVar5 = 0;
  }
  else {
    if (*(int *)(lVar2 + 0x270) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar5 = (**(code **)(*plVar3 + 0xc0))(plVar3,msecs);
        return (bool)uVar5;
      }
      goto LAB_00252146;
    }
    QElapsedTimer::start();
    if (*(char *)(lVar2 + 0x275) == '\0') {
      bVar4 = waitForEncrypted(this,msecs);
      if (!bVar4) goto LAB_00252103;
    }
    if (((*(long *)(lVar2 + 0x98) != 0) && (*(long *)(*(long *)(lVar2 + 0x98) + 0x18) != 0)) &&
       (*(long **)(lVar2 + 0x408) != (long *)0x0)) {
      (**(code **)(**(long **)(lVar2 + 0x408) + 200))();
    }
    plVar3 = *(long **)(lVar2 + 0x3f8);
    iVar6 = QElapsedTimer::elapsed();
    uVar7 = qt_subtract_from_timeout(msecs,iVar6);
    uVar5 = (**(code **)(*plVar3 + 0xc0))(plVar3,uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar5;
  }
LAB_00252146:
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::waitForBytesWritten(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket)
        return false;
    if (d->mode == UnencryptedMode)
        return d->plainSocket->waitForBytesWritten(msecs);

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (!d->connectionEncrypted) {
        // Wait until we've entered encrypted mode, or until a failure occurs.
        if (!waitForEncrypted(msecs))
            return false;
    }
    if (!d->writeBuffer.isEmpty()) {
        // empty our cleartext write buffer first
        d->transmit();
    }

    return d->plainSocket->waitForBytesWritten(qt_subtract_from_timeout(msecs, stopWatch.elapsed()));
}